

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O2

bool __thiscall MyClient::Initialize(MyClient *this)

{
  MyClient *sdkConnection;
  OutputWorker *pOVar1;
  shared_ptr<MyClientConnection> connPtr;
  SDKJsonResult result;
  allocator local_1f1;
  string local_1f0;
  MyClient *local_1d0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_1c8;
  undefined1 local_1c0 [40];
  undefined1 local_198 [8];
  Level local_190;
  ostringstream local_188 [376];
  
  (this->super_SDKSocket).Config.UDPListenPort = 0;
  (this->super_SDKSocket).Config.MaximumClients = 10;
  (this->super_SDKSocket).Config.BandwidthLimitBPS = 4000000;
  (this->super_SDKSocket).Config.Flags = 6;
  tonk::SDKSocket::Create((SDKJsonResult *)local_1c0,&this->super_SDKSocket);
  if (local_1c0._0_4_ == Tonk_Success) {
    local_198 = (undefined1  [8])this;
    std::make_shared<MyClientConnection,MyClient*>(&local_1d0);
    test::FunctionTimer::BeginCall((FunctionTimer *)test::t_tonk_connect);
    sdkConnection = local_1d0;
    std::__cxx11::string::string((string *)&local_1f0,"localhost",&local_1f1);
    tonk::SDKSocket::Connect
              ((SDKJsonResult *)local_198,&this->super_SDKSocket,(SDKConnection *)sdkConnection,
               &local_1f0,0x13c4);
    tonk::SDKJsonResult::operator=((SDKJsonResult *)local_1c0,(SDKJsonResult *)local_198);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1f0);
    test::FunctionTimer::EndCall((FunctionTimer *)test::t_tonk_connect);
    if (local_1c0._0_4_ == Tonk_Success) {
      test::SendPreconnectData((SDKConnection *)local_1d0);
    }
    else {
      std::__cxx11::string::string((string *)&local_1f0,(string *)(local_1c0 + 8));
      if ((int)Logger.ChannelMinLevel < 5) {
        local_198 = (undefined1  [8])Logger.ChannelName;
        local_190 = Error;
        std::__cxx11::ostringstream::ostringstream(local_188);
        std::operator<<((ostream *)local_188,(string *)&Logger.Prefix);
        std::operator<<((ostream *)local_188,"Unable to connect: ");
        std::operator<<((ostream *)local_188,(string *)&local_1f0);
        pOVar1 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)local_198);
        std::__cxx11::ostringstream::~ostringstream(local_188);
      }
      std::__cxx11::string::~string((string *)&local_1f0);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_1c8);
  }
  else {
    std::__cxx11::string::string((string *)&local_1f0,(string *)(local_1c0 + 8));
    if ((int)Logger.ChannelMinLevel < 5) {
      local_198 = (undefined1  [8])Logger.ChannelName;
      local_190 = Error;
      std::__cxx11::ostringstream::ostringstream(local_188);
      std::operator<<((ostream *)local_188,(string *)&Logger.Prefix);
      std::operator<<((ostream *)local_188,"Unable to create socket: ");
      std::operator<<((ostream *)local_188,(string *)&local_1f0);
      pOVar1 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar1,(LogStringBuffer *)local_198);
      std::__cxx11::ostringstream::~ostringstream(local_188);
    }
    std::__cxx11::string::~string((string *)&local_1f0);
  }
  std::__cxx11::string::~string((string *)(local_1c0 + 8));
  return local_1c0._0_4_ == Tonk_Success;
}

Assistant:

bool MyClient::Initialize()
{
    // Set configuration
    Config.UDPListenPort = 0;
    Config.MaximumClients = 10;
    Config.Flags = TONK_FLAGS_ENABLE_UPNP;
    Config.Flags |= TONK_FLAGS_DISABLE_COMPRESSION;
    Config.BandwidthLimitBPS = 4000000;

    tonk::SDKJsonResult result = Create();
    if (!result)
    {
        Logger.Error("Unable to create socket: ", result.ToString());
        return result;
    }

    auto connPtr = std::make_shared<MyClientConnection>(this);

    t_tonk_connect.BeginCall();
    result = Connect(
        connPtr.get(),
        TONK_TEST_SERVER_IP,
        kUDPServerPort_Client);
    t_tonk_connect.EndCall();

    if (!result) {
        Logger.Error("Unable to connect: ", result.ToString());
    }
    else {
        SendPreconnectData(connPtr.get());
    }

    return result;
}